

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::FramebufferDefaultStateQueryTests::init
          (FramebufferDefaultStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar2;
  TestNode *pTVar3;
  long *plVar4;
  long *plVar5;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"framebuffer_default_width_","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,(char *)local_70,"Test FRAMEBUFFER_DEFAULT_WIDTH")
  ;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x11;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b50a10;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"framebuffer_default_height_","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,(char *)local_70,"Test FRAMEBUFFER_DEFAULT_HEIGHT"
            );
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3[1].m_testCtx = (TestContext *)0x100000011;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b50a10;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"framebuffer_default_samples_","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,(char *)local_70,
             "Test FRAMEBUFFER_DEFAULT_SAMPLES");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x11;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b50ad0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"framebuffer_default_fixed_sample_locations_","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar1->m_testCtx,(char *)local_70,
             "Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x11;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b50b30;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  iVar2 = extraout_EAX;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
    iVar2 = extraout_EAX_00;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar2 = extraout_EAX_01;
  }
  return iVar2;
}

Assistant:

void FramebufferDefaultStateQueryTests::init (void)
{
	static const QueryType verifiers[] =
	{
		QUERY_FRAMEBUFFER_INTEGER,
	};

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];								\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_WIDTH,	(std::string("framebuffer_default_width_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_WIDTH"));
	FOR_EACH_VERIFIER(new FramebufferDimensionTest				(m_context, verifier, FramebufferDimensionTest::DIMENSION_HEIGHT,	(std::string("framebuffer_default_height_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_HEIGHT"));
	FOR_EACH_VERIFIER(new FramebufferSamplesTest				(m_context, verifier,												(std::string("framebuffer_default_samples_") + verifierSuffix).c_str(),					"Test FRAMEBUFFER_DEFAULT_SAMPLES"));
	FOR_EACH_VERIFIER(new FramebufferFixedSampleLocationsTest	(m_context, verifier,												(std::string("framebuffer_default_fixed_sample_locations_") + verifierSuffix).c_str(),	"Test FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS"));

#undef FOR_EACH_VERIFIER
}